

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex00m2.cpp
# Opt level: O0

int main(void)

{
  undefined8 uVar1;
  mapped_type mVar2;
  bool bVar3;
  bool bVar4;
  istream *piVar5;
  size_type sVar6;
  reference pvVar7;
  mapped_type *pmVar8;
  reference pvVar9;
  map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>> *this;
  const_reference pvVar10;
  vector<int,std::allocator<int>> *this_00;
  reference this_01;
  reference piVar11;
  ostream *poVar12;
  int *y;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  vector<int,_std::allocator<int>_> *x;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range1;
  reference local_110;
  pair<const_int,_int> *k;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>_>
  pq;
  size_t e;
  undefined1 local_c0 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  user_winnings;
  _Self local_98;
  int local_8c;
  _Self local_88;
  iterator it;
  int local_78;
  char action;
  int i_1;
  vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  vm;
  int local_50;
  int P;
  int I;
  int U;
  int i;
  allocator<int> local_31;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> v;
  int A;
  int M;
  int N;
  
  M = 0;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  piVar5 = (istream *)std::istream::operator>>((istream *)&std::cin,&A);
  piVar5 = (istream *)
           std::istream::operator>>
                     (piVar5,(int *)((long)&v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_end_of_storage + 4));
  std::istream::operator>>
            (piVar5,(int *)&v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
  sVar6 = (size_type)A;
  std::allocator<int>::allocator(&local_31);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,sVar6,&local_31);
  std::allocator<int>::~allocator(&local_31);
  for (I = 0; I < A; I = I + 1) {
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_30,(long)I);
    std::istream::operator>>((istream *)&std::cin,pvVar7);
  }
  std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>::
  allocator((allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
             *)&action);
  std::
  vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ::vector((vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
            *)&i_1,(long)A,
           (allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
            *)&action);
  std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>::
  ~allocator((allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>
              *)&action);
  for (local_78 = 0;
      local_78 <
      (int)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage; local_78 = local_78 + 1) {
    std::operator>>((istream *)&std::cin,(char *)((long)&it._M_node + 7));
    if (it._M_node._7_1_ == 'B') {
      piVar5 = (istream *)std::istream::operator>>((istream *)&std::cin,&P);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&local_50);
      std::istream::operator>>
                (piVar5,(int *)((long)&vm.
                                       super__Vector_base<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      mVar2 = vm.
              super__Vector_base<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      pvVar9 = std::
               vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
               ::operator[]((vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                             *)&i_1,(long)(local_50 + -1));
      it._M_node._0_4_ = P + -1;
      pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](pvVar9,(key_type *)&it);
      *pmVar8 = mVar2;
    }
    else if (it._M_node._7_1_ == 'W') {
      piVar5 = (istream *)std::istream::operator>>((istream *)&std::cin,&P);
      std::istream::operator>>(piVar5,&local_50);
      pvVar9 = std::
               vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
               ::operator[]((vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                             *)&i_1,(long)(local_50 + -1));
      local_8c = P + -1;
      local_88._M_node =
           (_Base_ptr)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                     (pvVar9,&local_8c);
      pvVar9 = std::
               vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
               ::operator[]((vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                             *)&i_1,(long)(local_50 + -1));
      local_98._M_node =
           (_Base_ptr)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                     (pvVar9);
      bVar3 = std::operator!=(&local_88,&local_98);
      if (bVar3) {
        this = (map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>> *)
               std::
               vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
               ::operator[]((vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                             *)&i_1,(long)(local_50 + -1));
        user_winnings.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>::
                      erase_abi_cxx11_(this,(iterator)local_88._M_node);
      }
    }
  }
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&e + 7));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_c0,
           (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage._4_4_,
           (allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&e + 7));
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&e + 7));
  for (pq._24_8_ = 0; uVar1 = pq._24_8_,
      sVar6 = std::
              vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
              ::size((vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                      *)&i_1), (ulong)uVar1 < sVar6; pq._24_8_ = pq._24_8_ + 1) {
    std::
    priority_queue<std::pair<int,int>,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>,std::less<std::pair<int,int>>>
    ::priority_queue<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>,void>
              ((priority_queue<std::pair<int,int>,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>,std::less<std::pair<int,int>>>
                *)&__range2);
    pvVar9 = std::
             vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
             ::operator[]((vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                           *)&i_1,pq._24_8_);
    __end2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                       (pvVar9);
    k = (pair<const_int,_int> *)
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end(pvVar9)
    ;
    while (bVar3 = std::operator!=(&__end2,(_Self *)&k), bVar3) {
      local_110 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator*(&__end2);
      __range1 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)std::make_pair<int&,int_const&>(&local_110->second,&local_110->first);
      std::
      priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>_>
      ::push((priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>_>
              *)&__range2,(value_type *)&__range1);
      std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++(&__end2);
    }
    while( true ) {
      bVar4 = std::
              priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>_>
              ::empty((priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>_>
                       *)&__range2);
      bVar3 = false;
      if (!bVar4) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_30,pq._24_8_);
        bVar3 = 0 < *pvVar7;
      }
      if (!bVar3) break;
      pvVar10 = std::
                priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>_>
                ::top((priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>_>
                       *)&__range2);
      this_00 = (vector<int,std::allocator<int>> *)
                std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)local_c0,(long)pvVar10->second);
      std::vector<int,std::allocator<int>>::emplace_back<unsigned_long&>
                (this_00,(unsigned_long *)&pq.field_0x18);
      std::
      priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>_>
      ::pop((priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>_>
             *)&__range2);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_30,pq._24_8_);
      *pvVar7 = *pvVar7 + -1;
    }
    std::
    priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>_>
    ::~priority_queue((priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>_>
                       *)&__range2);
  }
  __end1 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::begin((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)local_c0);
  x = (vector<int,_std::allocator<int>_> *)
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::end((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_c0);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                     *)&x), bVar3) {
    this_01 = __gnu_cxx::
              __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator*(&__end1);
    sVar6 = std::vector<int,_std::allocator<int>_>::size(this_01);
    if (sVar6 == 0) {
      std::operator<<((ostream *)&std::cout,"NONE\n");
    }
    else {
      __end3 = std::vector<int,_std::allocator<int>_>::begin(this_01);
      y = (int *)std::vector<int,_std::allocator<int>_>::end(this_01);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                         *)&y), bVar3) {
        piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end3);
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar11 + 1);
        std::operator<<(poVar12," ");
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3);
      }
      std::operator<<((ostream *)&std::cout,"\n");
    }
    __gnu_cxx::
    __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_c0);
  std::
  vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ::~vector((vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
             *)&i_1);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return M;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);
    int N, M, A;
    cin >> N >> M >> A;
    vector<int> v(N);
    for (int i = 0; i < N; ++i) {
        cin >> v[i];
    }
    int U, I, P;
    vector<map<int, int>> vm(N);
    for (int i = 0; i < A; ++i) {
        char action;
        cin >> action;
        switch (action) {
        case 'B':
            cin >> U >> I >> P;
            vm[I - 1][U - 1] = P;
            break;
        case 'W':
            cin >> U >> I;
            auto it = vm[I - 1].find(U - 1);
            if (it != vm[I - 1].end()) {
                vm[I - 1].erase(it);
            }
            break;
        }
    }
    vector<vector<int>> user_winnings(M);
    for (size_t e = 0; e < vm.size(); e++) {
        priority_queue<pii> pq;
        for (auto &k : vm[e]) {
            pq.push(make_pair(k.second, k.first));
        }
        while (!pq.empty() && v[e] > 0) {
            user_winnings[pq.top().second].emplace_back(e);
            pq.pop();
            v[e]--;
        }
    }
    for (auto &x : user_winnings) {
        if (x.size() > 0) {
            for (auto &y : x) {
                cout << y + 1 << " ";
            }
            cout << "\n";
        } else {
            cout << "NONE\n";
        }
    }
}